

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  u16 uVar1;
  MemPage *pMVar2;
  byte bVar3;
  u32 uVar4;
  int iVar5;
  ushort uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)flags;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  if (pCur->eState == '\0') {
    uVar1 = pCur->ix;
    uVar6 = uVar1 + 1;
    pCur->ix = uVar6;
    if (pCur->pPage->nCell <= uVar6) {
      pCur->ix = uVar1;
      iVar5 = btreeNext(pCur);
      return iVar5;
    }
    if (pCur->pPage->leaf == '\0') {
      iVar5 = 0;
      while ((iVar5 == 0 && (pMVar2 = pCur->pPage, pMVar2->leaf == '\0'))) {
        uVar4 = sqlite3Get4byte(pMVar2->aData +
                                (CONCAT11(pMVar2->aCellIdx[(ulong)pCur->ix * 2],
                                          pMVar2->aCellIdx[(ulong)pCur->ix * 2 + 1]) &
                                pMVar2->maskPage));
        iVar5 = moveToChild(pCur,uVar4);
      }
      return iVar5;
    }
    return 0;
  }
  bVar3 = pCur->eState;
  if (bVar3 != 0) {
    if (2 < bVar3) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 1) {
      return 0x65;
    }
    if ((bVar3 == 2) && (pCur->eState = '\0', 0 < pCur->skipNext)) {
      return 0;
    }
  }
  pMVar2 = pCur->pPage;
  uVar6 = pCur->ix + 1;
  pCur->ix = uVar6;
  if (pMVar2->isInit == '\0') {
    iVar5 = sqlite3CorruptError(0x10d06);
    return iVar5;
  }
  if (uVar6 < pMVar2->nCell) {
    if (pMVar2->leaf == '\0') {
LAB_001461ef:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar2->leaf == '\0') {
      uVar4 = sqlite3Get4byte(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar4);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_001461ef;
    }
    do {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    } while (pCur->pPage->nCell <= pCur->ix);
    if (pCur->pPage->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,(int)uVar7);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->pPage;
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}